

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_palette_add(LodePNGColorMode *info,uchar r,uchar g,uchar b,uchar a)

{
  uchar in_CL;
  uchar in_DL;
  uchar in_SIL;
  LodePNGColorMode *in_RDI;
  uchar in_R8B;
  uint local_4;
  
  if ((in_RDI->palette == (uchar *)0x0) &&
     (lodepng_color_mode_alloc_palette(in_RDI), in_RDI->palette == (uchar *)0x0)) {
    local_4 = 0x53;
  }
  else if (in_RDI->palettesize < 0x100) {
    in_RDI->palette[in_RDI->palettesize * 4] = in_SIL;
    in_RDI->palette[in_RDI->palettesize * 4 + 1] = in_DL;
    in_RDI->palette[in_RDI->palettesize * 4 + 2] = in_CL;
    in_RDI->palette[in_RDI->palettesize * 4 + 3] = in_R8B;
    in_RDI->palettesize = in_RDI->palettesize + 1;
    local_4 = 0;
  }
  else {
    local_4 = 0x6c;
  }
  return local_4;
}

Assistant:

unsigned lodepng_palette_add(LodePNGColorMode* info,
                             unsigned char r, unsigned char g, unsigned char b, unsigned char a) {
  if(!info->palette) /*allocate palette if empty*/ {
    lodepng_color_mode_alloc_palette(info);
    if(!info->palette) return 83; /*alloc fail*/
  }
  if(info->palettesize >= 256) {
    return 108; /*too many palette values*/
  }
  info->palette[4 * info->palettesize + 0] = r;
  info->palette[4 * info->palettesize + 1] = g;
  info->palette[4 * info->palettesize + 2] = b;
  info->palette[4 * info->palettesize + 3] = a;
  ++info->palettesize;
  return 0;
}